

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

void __thiscall FIX::Acceptor::~Acceptor(Acceptor *this)

{
  _Base_ptr p_Var1;
  
  this->_vptr_Acceptor = (_func_int **)&PTR__Acceptor_001fc4c0;
  for (p_Var1 = (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[0xb]._M_left != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[0xb]._M_left + 8))();
    }
  }
  if ((this->m_pLogFactory != (LogFactory *)0x0) && (this->m_pLog != (Log *)0x0)) {
    (**(code **)(*(long *)this->m_pLogFactory + 0x20))();
  }
  SessionSettings::~SessionSettings(&this->m_settings);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_sessionIDs)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::~_Rb_tree(&(this->m_sessions)._M_t);
  return;
}

Assistant:

Acceptor::~Acceptor() {
  Sessions::iterator i;
  for (i = m_sessions.begin(); i != m_sessions.end(); ++i) {
    delete i->second;
  }

  if (m_pLogFactory && m_pLog) {
    m_pLogFactory->destroy(m_pLog);
  }
}